

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O3

ecs_entity_t
ecs_find_in_type(ecs_world_t *world,ecs_type_t type,ecs_entity_t component,ecs_entity_t flags)

{
  _Bool _Var1;
  uint uVar2;
  void *pvVar3;
  ecs_type_t type_00;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = ecs_vector_count(type);
  pvVar3 = _ecs_vector_first(type,8,0x10);
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      uVar4 = *(ulong *)((long)pvVar3 + uVar5 * 8);
      if ((flags == 0) || ((uVar4 & flags) == flags)) {
        uVar4 = uVar4 & 0xffffffffffffff;
        if (component == 0) {
          return uVar4;
        }
        type_00 = ecs_get_type(world,uVar4);
        _Var1 = ecs_type_has_entity(world,type_00,component);
        if (_Var1) {
          return uVar4;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  return 0;
}

Assistant:

ecs_entity_t ecs_find_in_type(
    ecs_world_t *world,
    ecs_type_t type,
    ecs_entity_t component,
    ecs_entity_t flags)
{
    ecs_vector_each(type, ecs_entity_t, c_ptr, {
        ecs_entity_t c = *c_ptr;

        if (flags) {
            if ((c & flags) != flags) {
                continue;
            }
        }

        ecs_entity_t e = c & ECS_COMPONENT_MASK;

        if (component) {
           ecs_type_t component_type = ecs_get_type(world, e);
           if (!ecs_type_has_entity(world, component_type, component)) {
               continue;
           }
        }

        return e;
    });

    return 0;
}